

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

int __thiscall Widget_Browser::handle(Widget_Browser *this,int e)

{
  int iVar1;
  Fl_Type *pFVar2;
  long *plVar3;
  Fl_Type *pFVar4;
  Fl_Type *pFVar5;
  int X;
  int H;
  int W;
  int Y;
  
  Fl_Browser_::bbox(&this->super_Fl_Browser_,&X,&Y,&W,&H);
  pFVar2 = pushedtitle;
  if (e != 5) {
    if (e == 2) {
      if (handle::title != (Fl_Type *)0x0) {
        pushedtitle = (Fl_Type *)0x0;
        handle::title = (Fl_Type *)0x0;
        if (pFVar2 == (Fl_Type *)0x0) {
          pushedtitle = (Fl_Type *)0x0;
          handle::title = (Fl_Type *)0x0;
          return 1;
        }
        if (pFVar2->open_ != '\0') {
          pFVar2->open_ = '\0';
          pFVar5 = pFVar2;
          while ((pFVar5 = pFVar5->next, pFVar5 != (Fl_Type *)0x0 && (pFVar2->level < pFVar5->level)
                 )) {
            pFVar5->visible = '\0';
          }
LAB_00181e05:
          Fl_Widget::redraw((Fl_Widget *)this);
          return 1;
        }
        pFVar2->open_ = '\x01';
        pFVar5 = pFVar2->next;
        do {
          pFVar4 = pFVar5;
          if ((pFVar4 == (Fl_Type *)0x0) || (pFVar4->level <= pFVar2->level)) goto LAB_00181e05;
          pFVar4->visible = '\x01';
          iVar1 = (*pFVar4->_vptr_Fl_Type[0x16])(pFVar4);
          if ((iVar1 == 0) || (pFVar5 = pFVar4, pFVar4->open_ != '\0')) {
            pFVar5 = pFVar4->next;
          }
          else {
            do {
              pFVar5 = pFVar5->next;
              if (pFVar5 == (Fl_Type *)0x0) {
                pFVar5 = (Fl_Type *)0x0;
                break;
              }
            } while (pFVar4->level < pFVar5->level);
          }
        } while( true );
      }
      plVar3 = (long *)Fl_Browser_::find_item(&this->super_Fl_Browser_,Fl::e_y);
      if (((plVar3 != (long *)0x0) && ((char)plVar3[8] != '\0')) &&
         ((Fl::e_clicks != 0 || ((Fl::e_state._2_1_ & 4) != 0)))) {
        (**(code **)(*plVar3 + 0x58))(plVar3);
      }
    }
    else if (((e == 1) && (iVar1 = Fl::event_inside(X,Y,W,H), iVar1 != 0)) &&
            (pFVar2 = (Fl_Type *)Fl_Browser_::find_item(&this->super_Fl_Browser_,Fl::e_y),
            pFVar2 != (Fl_Type *)0x0)) {
      X = X + ((pFVar2->level * 0xc | 3U) - (this->super_Fl_Browser_).hposition_);
      iVar1 = (*pFVar2->_vptr_Fl_Type[0x16])(pFVar2);
      if ((iVar1 != 0) && (Fl::e_x < X + 0xd && X < Fl::e_x)) {
        pushedtitle = pFVar2;
        handle::title = pFVar2;
        Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pFVar2);
        return 1;
      }
    }
LAB_00181d95:
    iVar1 = Fl_Browser_::handle(&this->super_Fl_Browser_,e);
    return iVar1;
  }
  if (handle::title == (Fl_Type *)0x0) goto LAB_00181d95;
  pFVar2 = (Fl_Type *)Fl_Browser_::find_item(&this->super_Fl_Browser_,Fl::e_y);
  if (pFVar2 != (Fl_Type *)0x0) {
    X = X + ((pFVar2->level * 0xc | 3U) - (this->super_Fl_Browser_).hposition_);
    iVar1 = (*pFVar2->_vptr_Fl_Type[0x16])(pFVar2);
    if ((iVar1 != 0) && (X < Fl::e_x && Fl::e_x < X + 0xd)) goto LAB_00181d22;
  }
  pFVar2 = (Fl_Type *)0x0;
LAB_00181d22:
  if (pFVar2 == pushedtitle) {
    return 1;
  }
  if (pushedtitle != (Fl_Type *)0x0) {
    Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pushedtitle);
  }
  if (pFVar2 == (Fl_Type *)0x0) {
    pushedtitle = pFVar2;
    return 1;
  }
  Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pFVar2);
  pushedtitle = pFVar2;
  return 1;
}

Assistant:

int Widget_Browser::handle(int e) {
  static Fl_Type *title;
  Fl_Type *l;
  int X,Y,W,H; bbox(X,Y,W,H);
  switch (e) {
  case FL_PUSH:
    if (!Fl::event_inside(X,Y,W,H)) break;
    l = (Fl_Type*)find_item(Fl::event_y());
    if (l) {
      X += 3 + 12*l->level - hposition();
      if (l->is_parent() && Fl::event_x()>X && Fl::event_x()<X+13) {
	title = pushedtitle = l;
	redraw_line(l);
	return 1;
      }
    }
    break;
  case FL_DRAG:
    if (!title) break;
    l = (Fl_Type*)find_item(Fl::event_y());
    if (l) {
      X += 3 + 12*l->level - hposition();
      if (l->is_parent() && Fl::event_x()>X && Fl::event_x()<X+13) ;
      else l = 0;
    }
    if (l != pushedtitle) {
      if (pushedtitle) redraw_line(pushedtitle);
      if (l) redraw_line(l);
      pushedtitle = l;
    }
    return 1;
  case FL_RELEASE:
    if (!title) {
      l = (Fl_Type*)find_item(Fl::event_y());
      if (l && l->new_selected && (Fl::event_clicks() || Fl::event_state(FL_CTRL)))
	l->open();
      break;
    }
    l = pushedtitle;
    title = pushedtitle = 0;
    if (l) {
      if (l->open_) {
	l->open_ = 0;
	for (Fl_Type*k = l->next; k&&k->level>l->level; k = k->next)
	  k->visible = 0;
      } else {
	l->open_ = 1;
	for (Fl_Type*k=l->next; k&&k->level>l->level;) {
	  k->visible = 1;
	  if (k->is_parent() && !k->open_) {
	    Fl_Type *j;
	    for (j = k->next; j && j->level>k->level; j = j->next) {/*empty*/}
	    k = j;
	  } else
	    k = k->next;
	}
      }
      redraw();
    }
    return 1;
  }
  return Fl_Browser_::handle(e);
}